

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O0

HighsInfo * __thiscall Highs::getHighsInfo(Highs *this)

{
  HighsInfo *pHVar1;
  Highs *in_RDI;
  string *alt_method_name;
  string *in_stack_ffffffffffffff98;
  Highs *in_stack_ffffffffffffffa0;
  undefined1 local_29 [41];
  
  alt_method_name = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"getHighsInfo",(allocator *)alt_method_name)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"getInfo",(allocator *)&stack0xffffffffffffff9f);
  deprecationMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  pHVar1 = getInfo(in_RDI);
  return pHVar1;
}

Assistant:

const HighsInfo& Highs::getHighsInfo() const {
  deprecationMessage("getHighsInfo", "getInfo");
  return getInfo();
}